

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::HasProperty
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,bool *noRedecl
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  Type TVar2;
  int iVar3;
  ScriptContext *this_00;
  bool bVar4;
  BOOL BVar5;
  undefined8 in_RAX;
  Type *pTVar6;
  int iVar7;
  BOOL unaff_R12D;
  uint32 local_34 [2];
  uint32 indexVal;
  
  local_34[0] = (uint32)((ulong)in_RAX >> 0x20);
  if (noRedecl != (bool *)0x0) {
    *noRedecl = false;
  }
  iVar3 = this->propertyCount;
  bVar4 = 0 < iVar3;
  if (0 < iVar3) {
    pTVar6 = this->descriptors;
    iVar7 = 0;
    if ((this->descriptors[0].Id.ptr)->pid != propertyId) {
      do {
        if (iVar3 + -1 == iVar7) {
          bVar4 = false;
          goto LAB_00e5146e;
        }
        pTVar1 = pTVar6 + 1;
        pTVar6 = pTVar6 + 1;
        iVar7 = iVar7 + 1;
      } while (((pTVar1->Id).ptr)->pid != propertyId);
      bVar4 = iVar7 < iVar3;
    }
    unaff_R12D = 0;
    if (((pTVar6->field_1).Attributes & 8) == 0) {
      if ((noRedecl != (bool *)0x0) && (0x3f < (pTVar6->field_1).Attributes)) {
        *noRedecl = true;
      }
      unaff_R12D = 1;
      if (info != (PropertyValueInfo *)0x0) {
        TVar2 = (pTVar6->field_1).Attributes;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = (PropertyIndex)iVar7;
        info->m_attributes = TVar2;
        info->flags = InlineCacheNoFlags;
      }
    }
  }
LAB_00e5146e:
  if (!bVar4) {
    this_00 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
    bVar4 = DynamicObject::HasObjectArray(instance);
    unaff_R12D = 0;
    if (bVar4) {
      BVar5 = ScriptContext::IsNumericPropertyId(this_00,propertyId,local_34);
      if (BVar5 != 0) {
        unaff_R12D = DynamicTypeHandler::HasItem
                               (&this->super_DynamicTypeHandler,instance,local_34[0]);
      }
    }
  }
  return unaff_R12D;
}

Assistant:

BOOL SimpleTypeHandler<size>::HasProperty(DynamicObject* instance, PropertyId propertyId, __out_opt bool *noRedecl, _Inout_opt_ PropertyValueInfo* info)
    {
        if (noRedecl != nullptr)
        {
            *noRedecl = false;
        }

        for (int i = 0; i < propertyCount; i++)
        {
            if (descriptors[i].Id->GetPropertyId() == propertyId)
            {
                if (descriptors[i].Attributes & PropertyDeleted)
                {
                    return false;
                }
                if (noRedecl && descriptors[i].Attributes & PropertyNoRedecl)
                {
                    *noRedecl = true;
                }

                if (info)
                {
                    PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(i), descriptors[i].Attributes);
                }
                return true;
            }
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        ScriptContext* scriptContext = instance->GetScriptContext();
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::HasItem(instance, indexVal);
        }

        return false;
    }